

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneSet
          (DeserializationCloner<Js::StreamReader> *this,Src src,Dst dst)

{
  scaposition_t src_00;
  Engine *this_00;
  Var local_38;
  Var value;
  int i;
  int32 size;
  JavascriptSet *set;
  Dst dst_local;
  DeserializationCloner<Js::StreamReader> *pDStack_10;
  Src src_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  set = (JavascriptSet *)dst;
  dst_local._4_4_ = src;
  pDStack_10 = this;
  _i = VarTo<Js::JavascriptSet>(dst);
  StreamReader::Read<int>(this->m_reader,(int *)((long)&value + 4));
  value._0_4_ = 0;
  while( true ) {
    if (value._4_4_ <= (int)value) {
      return;
    }
    this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    src_00 = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (this_00,src_00,&local_38);
    if (local_38 == (Var)0x0) break;
    JavascriptSet::Add(_i,local_38);
    value._0_4_ = (int)value + 1;
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void DeserializationCloner<Reader>::CloneSet(Src src, Dst dst)
    {
        JavascriptSet* set = VarTo<JavascriptSet>(dst);

        int32 size;
        m_reader->Read(&size);

        for (int i = 0; i < size; i++)
        {
            Var value;

            this->GetEngine()->Clone(m_reader->GetPosition(), &value);
            if (!value)
            {
                this->ThrowSCADataCorrupt();
            }

            set->Add(value);
        }
    }